

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

PHYSFS_EnumerateCallbackResult enumCallbackFilterSymLinks(void *_data,char *origdir,char *fname)

{
  undefined8 uVar1;
  code *pcVar2;
  int iVar3;
  PHYSFS_ErrorCode PVar4;
  PHYSFS_EnumerateCallbackResult PVar5;
  size_t sVar6;
  size_t sVar7;
  char *__s;
  undefined1 *puVar8;
  undefined1 *ptr;
  char *pcVar9;
  char *__s_00;
  ulong len;
  undefined1 local_68 [8];
  PHYSFS_Stat statbuf;
  
  puVar8 = local_68;
  statbuf._32_8_ = *(undefined8 *)((long)_data + 0x10);
  __s_00 = *(char **)((long)_data + 0x18) + (**(char **)((long)_data + 0x18) == '/');
  sVar6 = strlen(__s_00);
  sVar7 = strlen(fname);
  len = sVar7 + sVar6 + 2;
  if (len < 0x100) {
    puVar8 = local_68 + -(sVar7 + sVar6 + 0x19 & 0xfffffffffffffff0);
    ptr = puVar8;
  }
  else {
    ptr = (undefined1 *)0x0;
  }
  *(undefined8 *)(puVar8 + -8) = 0x108df3;
  __s = (char *)__PHYSFS_initSmallAlloc(ptr,len);
  if (__s == (char *)0x0) {
    *(undefined4 *)((long)_data + 0x20) = 2;
    *(undefined8 *)(puVar8 + -8) = 0xffffffffffffffff;
    return (PHYSFS_EnumerateCallbackResult)*(undefined8 *)(puVar8 + -8);
  }
  pcVar9 = "/";
  if (*__s_00 == '\0') {
    pcVar9 = "";
  }
  *(undefined8 *)(puVar8 + -8) = 0x108e2c;
  snprintf(__s,len,"%s%s%s",__s_00,pcVar9,fname);
  uVar1 = *(undefined8 *)statbuf._32_8_;
  pcVar2 = *(code **)(*(long *)(statbuf._32_8_ + 0x28) + 0x68);
  *(undefined8 *)(puVar8 + -8) = 0x108e41;
  iVar3 = (*pcVar2)(uVar1,__s,local_68);
  if (iVar3 == 0) {
    *(undefined8 *)(puVar8 + -8) = 0x108e61;
    PVar4 = currentErrorCode();
LAB_00108e7b:
    *(PHYSFS_ErrorCode *)((long)_data + 0x20) = PVar4;
    *(undefined8 *)(puVar8 + -8) = 0xffffffffffffffff;
  }
  else {
    if ((int)statbuf.accesstime != 2) {
      uVar1 = *(undefined8 *)((long)_data + 8);
      pcVar2 = *_data;
      *(undefined8 *)(puVar8 + -8) = 0x108e70;
      PVar5 = (*pcVar2)(uVar1,origdir,fname);
      if (PVar5 != PHYSFS_ENUM_ERROR) goto LAB_00108e82;
      *(undefined8 *)(puVar8 + -8) = 0x1d;
      PVar4 = (PHYSFS_ErrorCode)*(undefined8 *)(puVar8 + -8);
      goto LAB_00108e7b;
    }
    *(undefined8 *)(puVar8 + -8) = 1;
  }
  PVar5 = (PHYSFS_EnumerateCallbackResult)*(undefined8 *)(puVar8 + -8);
LAB_00108e82:
  if (*(long *)(__s + -8) != 0) {
    *(undefined8 *)(puVar8 + -8) = 0x108e97;
    (*__PHYSFS_AllocatorHooks.Free)(__s + -8);
  }
  return PVar5;
}

Assistant:

static PHYSFS_EnumerateCallbackResult enumCallbackFilterSymLinks(void *_data,
                                    const char *origdir, const char *fname)
{
    SymlinkFilterData *data = (SymlinkFilterData *) _data;
    const DirHandle *dh = data->dirhandle;
    const char *arcfname = data->arcfname;
    PHYSFS_Stat statbuf;
    const char *trimmedDir = (*arcfname == '/') ? (arcfname + 1) : arcfname;
    const size_t slen = strlen(trimmedDir) + strlen(fname) + 2;
    char *path = (char *) __PHYSFS_smallAlloc(slen);
    PHYSFS_EnumerateCallbackResult retval = PHYSFS_ENUM_OK;

    if (path == NULL)
    {
        data->errcode = PHYSFS_ERR_OUT_OF_MEMORY;
        return PHYSFS_ENUM_ERROR;
    } /* if */

    snprintf(path, slen, "%s%s%s", trimmedDir, *trimmedDir ? "/" : "", fname);

    if (!dh->funcs->stat(dh->opaque, path, &statbuf))
    {
        data->errcode = currentErrorCode();
        retval = PHYSFS_ENUM_ERROR;
    } /* if */
    else
    {
        /* Pass it on to the application if it's not a symlink. */
        if (statbuf.filetype != PHYSFS_FILETYPE_SYMLINK)
        {
            retval = data->callback(data->callbackData, origdir, fname);
            if (retval == PHYSFS_ENUM_ERROR)
                data->errcode = PHYSFS_ERR_APP_CALLBACK;
        } /* if */
    } /* else */

    __PHYSFS_smallFree(path);

    return retval;
}